

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::recordBufferQueryPreciseWithFlagTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice *ppVVar1;
  VkQueryPool obj;
  undefined8 uVar2;
  Handle<(vk::HandleType)24> HVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  deUint32 dVar6;
  VkResult VVar7;
  VkDevice device;
  DeviceInterface *vk;
  VkPhysicalDeviceFeatures *pVVar8;
  NotSupportedError *this;
  Unique<vk::VkCommandBuffer_s_*> primCmdBuf;
  Unique<vk::Handle<(vk::HandleType)11>_> queryPool;
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandBufferBeginInfo secBufferBeginInfo;
  VkCommandBufferBeginInfo primBufferBeginInfo;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkQueryPoolCreateInfo queryPoolCreateInfo;
  VkCommandBufferAllocateInfo secCmdBufParams;
  VkCommandBufferAllocateInfo primCmdBufParams;
  Move<vk::Handle<(vk::HandleType)11>_> local_1b8;
  deUint64 local_198;
  DeviceInterface *pDStack_190;
  VkDevice local_188;
  undefined8 uStack_180;
  undefined4 local_178;
  undefined4 uStack_174;
  Deleter<vk::Handle<(vk::HandleType)11>_> DStack_170;
  Move<vk::Handle<(vk::HandleType)24>_> local_158;
  undefined8 local_138;
  undefined8 local_130;
  undefined4 local_128;
  VkCommandPool local_118;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_110;
  undefined4 local_f8 [2];
  undefined8 local_f0;
  undefined4 local_e8;
  Move<vk::Handle<(vk::HandleType)24>_> *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  VkCommandPoolCreateInfo local_b0;
  VkQueryPoolCreateInfo local_98;
  VkCommandBufferAllocateInfo local_70;
  VkCommandBufferAllocateInfo local_50;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  dVar6 = Context::getUniversalQueueFamilyIndex(context);
  pVVar8 = Context::getDeviceFeatures(context);
  if (pVVar8->inheritedQueries != 0) {
    local_b0.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
    local_b0.pNext = (void *)0x0;
    local_b0.flags = 2;
    local_b0.queueFamilyIndex = dVar6;
    ::vk::createCommandPool(&local_158,vk,device,&local_b0,(VkAllocationCallbacks *)0x0);
    DStack_110.m_device =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    local_118.m_internal =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    DStack_110.m_deviceIface =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    local_50.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    local_50.pNext = (void *)0x0;
    local_50.commandPool.m_internal =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    local_50.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    local_50.commandBufferCount = 1;
    ::vk::allocateCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_158,vk,device,&local_50);
    pVVar5 = local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    pDVar4 = local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
    HVar3.m_internal =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    uVar2 = CONCAT44(local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator._4_4_,
                     local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator._0_4_);
    local_70.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    local_70.pNext = (void *)0x0;
    local_70.commandPool.m_internal = local_118.m_internal;
    local_70.level = VK_COMMAND_BUFFER_LEVEL_SECONDARY;
    local_70.commandBufferCount = 1;
    ::vk::allocateCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_158,vk,device,&local_70);
    uStack_180 = CONCAT44(local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                          m_allocator._4_4_,
                          local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                          m_allocator._0_4_);
    local_188 = local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
    local_198 = local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    pDStack_190 = local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                  m_deviceIface;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0x2a;
    uStack_d0 = 0;
    local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ = 0x29;
    local_138 = 0;
    local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0;
    local_130 = 0x100000001;
    local_128 = 0;
    local_f8[0] = 0x2a;
    local_f0 = 0;
    local_e8 = 0;
    local_98.flags = 0;
    local_98.queryType = VK_QUERY_TYPE_OCCLUSION;
    local_98.queryCount = 1;
    local_98.pipelineStatistics = 0;
    local_98.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
    local_98._4_4_ = 0;
    local_98.pNext = (void *)0x0;
    local_e0 = &local_158;
    ::vk::createQueryPool(&local_1b8,vk,device,&local_98,(VkAllocationCallbacks *)0x0);
    DStack_170.m_device._0_4_ =
         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device._0_4_;
    DStack_170.m_device._4_4_ =
         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device._4_4_;
    DStack_170.m_allocator._0_4_ =
         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator._0_4_;
    DStack_170.m_allocator._4_4_ =
         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator._4_4_;
    local_178 = (undefined4)
                local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal;
    uStack_174 = local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal.
                 _4_4_;
    DStack_170.m_deviceIface._0_4_ =
         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface._0_4_
    ;
    DStack_170.m_deviceIface._4_4_ =
         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface._4_4_
    ;
    VVar7 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_198,local_f8);
    ::vk::checkResult(VVar7,"vk.beginCommandBuffer(secCmdBuf.get(), &secBufferBeginInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xb1e);
    VVar7 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_198);
    ::vk::checkResult(VVar7,"vk.endCommandBuffer(secCmdBuf.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xb1f);
    VVar7 = (*vk->_vptr_DeviceInterface[0x49])(vk,HVar3.m_internal,&local_d8);
    ::vk::checkResult(VVar7,"vk.beginCommandBuffer(primCmdBuf.get(), &primBufferBeginInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xb21);
    (*vk->_vptr_DeviceInterface[0x70])(vk,HVar3.m_internal,CONCAT44(uStack_174,local_178),0,1);
    (*vk->_vptr_DeviceInterface[0x6e])(vk,HVar3.m_internal,CONCAT44(uStack_174,local_178),0,1);
    (*vk->_vptr_DeviceInterface[0x77])(vk,HVar3.m_internal,1,&local_198);
    (*vk->_vptr_DeviceInterface[0x6f])(vk,HVar3.m_internal,CONCAT44(uStack_174,local_178),0);
    VVar7 = (*vk->_vptr_DeviceInterface[0x4a])(vk,HVar3.m_internal);
    ::vk::checkResult(VVar7,"vk.endCommandBuffer(primCmdBuf.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xb2a);
    ppVVar1 = &local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device;
    local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal =
         (deUint64)ppVVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,
               "Successfully recorded a secondary command buffer allowing a precise occlusion query."
               ,"");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,
               (undefined1 *)
               (CONCAT44(local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                         m_deviceIface._4_4_,
                         local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                         m_deviceIface._0_4_) +
               local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal));
    if ((VkDevice *)
        local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal != ppVVar1
       ) {
      operator_delete((void *)local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object
                              .m_internal,
                      CONCAT44(local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.
                               deleter.m_device._4_4_,
                               local_1b8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.
                               deleter.m_device._0_4_) + 1);
    }
    obj.m_internal._4_4_ = uStack_174;
    obj.m_internal._0_4_ = local_178;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()(&DStack_170,obj);
    }
    if (local_198 != 0) {
      local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = local_198;
      (*pDStack_190->_vptr_DeviceInterface[0x48])(pDStack_190,local_188,uStack_180,1);
    }
    if (HVar3.m_internal != 0) {
      local_158.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
           HVar3.m_internal;
      (*pDVar4->_vptr_DeviceInterface[0x48])(pDVar4,pVVar5,uVar2,1);
    }
    if (local_118.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_110,local_118);
    }
    return __return_storage_ptr__;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"Inherited queries feature is not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
             ,0xad7);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus recordBufferQueryPreciseWithFlagTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	if (!context.getDeviceFeatures().inheritedQueries)
		TCU_THROW(NotSupportedError, "Inherited queries feature is not supported");

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		primCmdBufParams		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// sType;
		DE_NULL,													// pNext;
		*cmdPool,													// pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							// level;
		1u,															// flags;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &primCmdBufParams));

	// Secondary Command buffer params
	const VkCommandBufferAllocateInfo		secCmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// sType;
		DE_NULL,													// pNext;
		*cmdPool,													// pool;
		VK_COMMAND_BUFFER_LEVEL_SECONDARY,							// level;
		1u,															// flags;
	};
	const Unique<VkCommandBuffer>			secCmdBuf				(allocateCommandBuffer(vk, vkDevice, &secCmdBufParams));

	const VkCommandBufferBeginInfo			primBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,				// sType
		DE_NULL,													// pNext
		0u,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const VkCommandBufferInheritanceInfo	secBufferInheritInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO,
		DE_NULL,
		0u,															// renderPass
		0u,															// subpass
		0u,															// framebuffer
		VK_TRUE,													// occlusionQueryEnable
		VK_QUERY_CONTROL_PRECISE_BIT,								// queryFlags
		(VkQueryPipelineStatisticFlags)0u,							// pipelineStatistics
	};
	const VkCommandBufferBeginInfo			secBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,				// sType
		DE_NULL,													// pNext
		0u,															// flags
		&secBufferInheritInfo,
	};

	const VkQueryPoolCreateInfo				queryPoolCreateInfo		=
	{
		VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO,					// sType
		DE_NULL,													// pNext
		(VkQueryPoolCreateFlags)0,									// flags
		VK_QUERY_TYPE_OCCLUSION,									// queryType
		1u,															// entryCount
		0u,															// pipelineStatistics
	};
	Unique<VkQueryPool>						queryPool				(createQueryPool(vk, vkDevice, &queryPoolCreateInfo));

	VK_CHECK(vk.beginCommandBuffer(secCmdBuf.get(), &secBufferBeginInfo));
	VK_CHECK(vk.endCommandBuffer(secCmdBuf.get()));

	VK_CHECK(vk.beginCommandBuffer(primCmdBuf.get(), &primBufferBeginInfo));
	{
		vk.cmdResetQueryPool(primCmdBuf.get(), queryPool.get(), 0u, 1u);
		vk.cmdBeginQuery(primCmdBuf.get(), queryPool.get(), 0u, VK_QUERY_CONTROL_PRECISE_BIT);
		{
			vk.cmdExecuteCommands(primCmdBuf.get(), 1u, &secCmdBuf.get());
		}
		vk.cmdEndQuery(primCmdBuf.get(), queryPool.get(), 0u);
	}
	VK_CHECK(vk.endCommandBuffer(primCmdBuf.get()));

	return tcu::TestStatus::pass("Successfully recorded a secondary command buffer allowing a precise occlusion query.");
}